

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_slot.cpp
# Opt level: O0

SignalBase ** CsSignal::SlotBase::get_threadLocal_currentSender(void)

{
  long lVar1;
  
  lVar1 = __tls_get_addr(&PTR_0012cfb8);
  return (SignalBase **)(lVar1 + 8);
}

Assistant:

CsSignal::SignalBase *&CsSignal::SlotBase::get_threadLocal_currentSender()
{
#ifdef __APPLE__
   static __thread CsSignal::SignalBase *threadLocal_currentSender = nullptr;
#else
   static thread_local CsSignal::SignalBase *threadLocal_currentSender = nullptr;
#endif

   return threadLocal_currentSender;
}